

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O1

if2ip_result_t Curl_if2ip(int af,uint remote_scope,uint param_3,char *interf,char *buf,int buf_size)

{
  sockaddr *sa;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long *plVar5;
  if2ip_result_t iVar6;
  ifaddrs *head;
  char scope [12];
  char ipstr [64];
  char *local_a8;
  long *local_a0;
  char local_98 [16];
  char *local_88;
  size_t local_80;
  char local_78 [72];
  
  iVar2 = getifaddrs(&local_a0);
  if (iVar2 < 0) {
    iVar6 = IF2IP_NOT_FOUND;
  }
  else {
    if (local_a0 == (long *)0x0) {
      iVar6 = IF2IP_NOT_FOUND;
    }
    else {
      local_80 = (size_t)buf_size;
      iVar6 = IF2IP_NOT_FOUND;
      plVar5 = local_a0;
      local_88 = buf;
      do {
        if ((ushort *)plVar5[3] != (ushort *)0x0) {
          if ((uint)*(ushort *)plVar5[3] == af) {
            iVar2 = curl_strequal((char *)plVar5[1],interf);
            if (iVar2 != 0) {
              local_98[8] = '\0';
              local_98[9] = '\0';
              local_98[10] = '\0';
              local_98[0xb] = '\0';
              local_98[0] = '\0';
              local_98[1] = '\0';
              local_98[2] = '\0';
              local_98[3] = '\0';
              local_98[4] = '\0';
              local_98[5] = '\0';
              local_98[6] = '\0';
              local_98[7] = '\0';
              sa = (sockaddr *)plVar5[3];
              if (af == 10) {
                uVar3 = Curl_ipv6_scope(sa);
                if (uVar3 == remote_scope) {
                  local_a8 = sa->sa_data + 6;
                  if ((param_3 != 0) && (*(uint *)(sa[1].sa_data + 6) != param_3))
                  goto LAB_006b5895;
                  bVar1 = true;
                  iVar2 = 0;
                  if (*(uint *)(sa[1].sa_data + 6) != 0) {
                    curl_msnprintf(local_98,0xc,"%%%u");
                    iVar2 = 0;
                  }
                }
                else {
LAB_006b5895:
                  iVar6 = iVar6 + (iVar6 == IF2IP_NOT_FOUND);
                  bVar1 = false;
                  iVar2 = 4;
                }
                buf = local_88;
                if (bVar1) goto LAB_006b58d6;
              }
              else {
                local_a8 = sa->sa_data + 2;
LAB_006b58d6:
                pcVar4 = inet_ntop(af,local_a8,local_78,0x40);
                curl_msnprintf(buf,local_80,"%s%s",pcVar4,local_98);
                iVar6 = IF2IP_FOUND;
                iVar2 = 2;
              }
              if (iVar2 != 4) break;
            }
          }
          else if (iVar6 == IF2IP_NOT_FOUND) {
            iVar2 = curl_strequal((char *)plVar5[1],interf);
            iVar6 = (if2ip_result_t)(iVar2 != 0);
          }
        }
        plVar5 = (long *)*plVar5;
      } while (plVar5 != (long *)0x0);
    }
    freeifaddrs(local_a0);
  }
  return iVar6;
}

Assistant:

if2ip_result_t Curl_if2ip(int af,
#ifdef ENABLE_IPV6
                          unsigned int remote_scope,
                          unsigned int local_scope_id,
#endif
                          const char *interf,
                          char *buf, int buf_size)
{
  struct ifaddrs *iface, *head;
  if2ip_result_t res = IF2IP_NOT_FOUND;

#if defined(ENABLE_IPV6) && \
    !defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  (void) local_scope_id;
#endif

  if(getifaddrs(&head) >= 0) {
    for(iface = head; iface != NULL; iface = iface->ifa_next) {
      if(iface->ifa_addr) {
        if(iface->ifa_addr->sa_family == af) {
          if(strcasecompare(iface->ifa_name, interf)) {
            void *addr;
            const char *ip;
            char scope[12] = "";
            char ipstr[64];
#ifdef ENABLE_IPV6
            if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              unsigned int scopeid = 0;
#endif
              unsigned int ifscope = Curl_ipv6_scope(iface->ifa_addr);

              if(ifscope != remote_scope) {
                /* We are interested only in interface addresses whose scope
                   matches the remote address we want to connect to: global
                   for global, link-local for link-local, etc... */
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;
                continue;
              }

              addr =
                &((struct sockaddr_in6 *)(void *)iface->ifa_addr)->sin6_addr;
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              /* Include the scope of this interface as part of the address */
              scopeid = ((struct sockaddr_in6 *)(void *)iface->ifa_addr)
                            ->sin6_scope_id;

              /* If given, scope id should match. */
              if(local_scope_id && scopeid != local_scope_id) {
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;

                continue;
              }

              if(scopeid)
                msnprintf(scope, sizeof(scope), "%%%u", scopeid);
#endif
            }
            else
#endif
              addr =
                &((struct sockaddr_in *)(void *)iface->ifa_addr)->sin_addr;
            res = IF2IP_FOUND;
            ip = Curl_inet_ntop(af, addr, ipstr, sizeof(ipstr));
            msnprintf(buf, buf_size, "%s%s", ip, scope);
            break;
          }
        }
        else if((res == IF2IP_NOT_FOUND) &&
                strcasecompare(iface->ifa_name, interf)) {
          res = IF2IP_AF_NOT_SUPPORTED;
        }
      }
    }

    freeifaddrs(head);
  }

  return res;
}